

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O2

void __thiscall
WAVEFRONT::BuildMesh::NodeTriangle
          (BuildMesh *this,GeometryVertex *v1,GeometryVertex *v2,GeometryVertex *v3,bool textured)

{
  IntVector *this_00;
  float *texCoord;
  float *texCoord_00;
  float *pfVar1;
  float *texCoord_01;
  undefined3 in_register_00000081;
  int local_3c;
  int local_38;
  int local_34;
  
  pfVar1 = (float *)0x0;
  this_00 = &this->mIndices;
  texCoord_01 = v1->mTexel;
  texCoord = v3->mTexel;
  texCoord_00 = v2->mTexel;
  if (CONCAT31(in_register_00000081,textured) == 0) {
    texCoord_01 = pfVar1;
    texCoord = pfVar1;
    texCoord_00 = pfVar1;
  }
  local_34 = GetIndex(this,v1->mPos,texCoord_01);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_34);
  local_38 = GetIndex(this,v2->mPos,texCoord_00);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_38);
  local_3c = GetIndex(this,v3->mPos,texCoord);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  return;
}

Assistant:

virtual void NodeTriangle(const GeometryVertex *v1,const GeometryVertex *v2,const GeometryVertex *v3, bool textured)
	{
		mIndices.push_back( GetIndex(v1->mPos, textured ? v1->mTexel : NULL) );
		mIndices.push_back( GetIndex(v2->mPos, textured ? v2->mTexel : NULL) );
		mIndices.push_back( GetIndex(v3->mPos, textured ? v3->mTexel : NULL) );
	}